

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O3

void __thiscall defyx::JitCompilerX86::h_ISMULH_M(JitCompilerX86 *this,Instruction *instr,int i)

{
  byte bVar1;
  uint8_t *puVar2;
  int iVar3;
  uint uVar4;
  
  bVar1 = instr->dst;
  this->registerUsage[bVar1] = i;
  if (instr->src == bVar1) {
    puVar2 = this->code;
    iVar3 = this->codePos;
    (puVar2 + iVar3)[0] = 'I';
    (puVar2 + iVar3)[1] = 0x8b;
    iVar3 = this->codePos + 2;
    this->codePos = iVar3;
    this->code[iVar3] = instr->dst + 0xc0;
    iVar3 = this->codePos;
    this->codePos = iVar3 + 1;
    puVar2 = this->code;
    (puVar2 + (long)iVar3 + 1)[0] = 'H';
    (puVar2 + (long)iVar3 + 1)[1] = 0xf7;
    iVar3 = this->codePos + 2;
    this->codePos = iVar3;
    this->code[iVar3] = 0xae;
    iVar3 = this->codePos + 1;
    this->codePos = iVar3;
    uVar4 = instr->imm32 & 0x3fff8;
  }
  else {
    genAddressReg(this,instr,false);
    puVar2 = this->code;
    iVar3 = this->codePos;
    (puVar2 + iVar3)[0] = 'I';
    (puVar2 + iVar3)[1] = 0x8b;
    iVar3 = this->codePos + 2;
    this->codePos = iVar3;
    this->code[iVar3] = instr->dst + 0xc0;
    iVar3 = this->codePos + 1;
    this->codePos = iVar3;
    uVar4 = 0xe2cf748;
  }
  *(uint *)(this->code + iVar3) = uVar4;
  iVar3 = this->codePos + 4;
  this->codePos = iVar3;
  puVar2 = this->code;
  (puVar2 + iVar3)[0] = 'L';
  (puVar2 + iVar3)[1] = 0x8b;
  iVar3 = this->codePos + 2;
  this->codePos = iVar3;
  this->code[iVar3] = instr->dst * '\b' + 0xc2;
  this->codePos = this->codePos + 1;
  return;
}

Assistant:

void JitCompilerX86::h_ISMULH_M(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			genAddressReg(instr, false);
			emit(REX_MOV_RR64);
			emitByte(0xc0 + instr.dst);
			emit(REX_IMUL_MEM);
		}
		else {
			emit(REX_MOV_RR64);
			emitByte(0xc0 + instr.dst);
			emit(REX_MUL_M);
			emitByte(0xae);
			genAddressImm(instr);
		}
		emit(REX_MOV_R64R);
		emitByte(0xc2 + 8 * instr.dst);
	}